

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseBrackets(Parser *this)

{
  Token *pTVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  Parser *in_RSI;
  Error<pfederc::SyntaxErrorCode> *local_30;
  
  sanityExpect(in_RSI,TOK_OP_BRACKET_OPEN);
  parseExpression(this,(Precedence)in_RSI);
  bVar5 = expect(in_RSI,TOK_BRACKET_CLOSE);
  if (!bVar5) {
    pTVar1 = in_RSI->lexer->currentToken;
    local_30 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
    sVar3 = (pTVar1->pos).line;
    sVar4 = (pTVar1->pos).startIndex;
    sVar2 = (pTVar1->pos).endIndex;
    local_30->logLevel = LVL_ERROR;
    local_30->err = STX_ERR_EXPECTED_CLOSING_BRACKET;
    (local_30->pos).line = sVar3;
    (local_30->pos).startIndex = sVar4;
    (local_30->pos).endIndex = sVar2;
    (local_30->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_30->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_30->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)&stack0xffffffffffffffd8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffd8);
    if (local_30 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_30,local_30);
    }
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseBrackets() noexcept {
  sanityExpect(TokenType::TOK_OP_BRACKET_OPEN);

  std::unique_ptr<Expr> result(parseExpression());
  if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET,
      lexer.getCurrentToken()->getPosition()));
  }

  return result;
}